

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::descriptor_unittest::FileDescriptorTest_BuildAgain_Test::TestBody
          (FileDescriptorTest_BuildAgain_Test *this)

{
  bool bVar1;
  char *pcVar2;
  uint32_t *puVar3;
  Arena *arena;
  FileDescriptor *pFVar4;
  char *in_R9;
  string local_1a0;
  AssertHelper local_180;
  Message local_178;
  bool local_169;
  undefined1 local_168 [8];
  AssertionResult gtest_ar_;
  Message local_150;
  FileDescriptor *local_148;
  undefined1 local_140 [8];
  AssertionResult gtest_ar;
  undefined1 local_120 [8];
  FileDescriptorProto file;
  FileDescriptorTest_BuildAgain_Test *this_local;
  
  file.field_0._224_8_ = this;
  FileDescriptorProto::FileDescriptorProto((FileDescriptorProto *)local_120);
  FileDescriptor::CopyTo
            ((this->super_FileDescriptorTest).foo_file_,(FileDescriptorProto *)local_120);
  local_148 = DescriptorPool::BuildFile
                        (&(this->super_FileDescriptorTest).pool_,(FileDescriptorProto *)local_120);
  testing::internal::EqHelper::
  Compare<const_google::protobuf::FileDescriptor_*,_const_google::protobuf::FileDescriptor_*,_nullptr>
            ((EqHelper *)local_140,"foo_file_","pool_.BuildFile(file)",
             &(this->super_FileDescriptorTest).foo_file_,&local_148);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_140);
  if (!bVar1) {
    testing::Message::Message(&local_150);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_140);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x1cc,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_.message_,&local_150);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
    testing::Message::~Message(&local_150);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_140);
  puVar3 = internal::HasBits<1>::operator[]
                     ((HasBits<1> *)&file.super_Message.super_MessageLite._internal_metadata_,0);
  *(byte *)puVar3 = (byte)*puVar3 | 2;
  arena = protobuf::MessageLite::GetArena((MessageLite *)local_120);
  internal::ArenaStringPtr::Set(&file.field_0._impl_.name_,"some.other.package",arena);
  pFVar4 = DescriptorPool::BuildFile
                     (&(this->super_FileDescriptorTest).pool_,(FileDescriptorProto *)local_120);
  local_169 = pFVar4 == (FileDescriptor *)0x0;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_168,&local_169,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_168);
  if (!bVar1) {
    testing::Message::Message(&local_178);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_1a0,(internal *)local_168,
               (AssertionResult *)"pool_.BuildFile(file) == nullptr","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_180,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x1d0,pcVar2);
    testing::internal::AssertHelper::operator=(&local_180,&local_178);
    testing::internal::AssertHelper::~AssertHelper(&local_180);
    std::__cxx11::string::~string((string *)&local_1a0);
    testing::Message::~Message(&local_178);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_168);
  FileDescriptorProto::~FileDescriptorProto((FileDescriptorProto *)local_120);
  return;
}

Assistant:

TEST_F(FileDescriptorTest, BuildAgain) {
  // Test that if we call BuildFile again on the same input we get the same
  // FileDescriptor back.
  FileDescriptorProto file;
  foo_file_->CopyTo(&file);
  EXPECT_EQ(foo_file_, pool_.BuildFile(file));

  // But if we change the file then it won't work.
  file.set_package("some.other.package");
  EXPECT_TRUE(pool_.BuildFile(file) == nullptr);
}